

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

void cleanup_pain(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (z_info->mp_max != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      lVar1 = 0;
      do {
        string_free(*(char **)((long)pain_messages->messages + lVar1 * 8 + lVar2));
        lVar1 = lVar1 + 1;
      } while (lVar1 != 7);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x48;
    } while (uVar3 < z_info->mp_max);
  }
  mem_free(pain_messages);
  return;
}

Assistant:

static void cleanup_pain(void)
{
	int idx, i;
	for (idx = 0; idx < z_info->mp_max; idx++) {
		for (i = 0; i < 7; i++) {
			string_free((char *)pain_messages[idx].messages[i]);
		}
	}
	mem_free(pain_messages);
}